

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::BlindTxInRequest::BlindTxInRequest
          (BlindTxInRequest *this,BlindTxInRequest *param_1)

{
  BlindTxInRequest *param_1_local;
  BlindTxInRequest *this_local;
  
  core::JsonClassBase<cfd::js::api::json::BlindTxInRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::BlindTxInRequest>,
             &param_1->super_JsonClassBase<cfd::js::api::json::BlindTxInRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::BlindTxInRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__BlindTxInRequest_01b4cb90;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items,&param_1->ignore_items);
  std::__cxx11::string::string((string *)&this->txid_,(string *)&param_1->txid_);
  this->vout_ = param_1->vout_;
  std::__cxx11::string::string((string *)&this->asset_,(string *)&param_1->asset_);
  std::__cxx11::string::string((string *)&this->blind_factor_,(string *)&param_1->blind_factor_);
  std::__cxx11::string::string
            ((string *)&this->asset_blind_factor_,(string *)&param_1->asset_blind_factor_);
  this->amount_ = param_1->amount_;
  return;
}

Assistant:

BlindTxInRequest() {
    CollectFieldName();
  }